

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.h
# Opt level: O2

bool __thiscall pbrt::Integrator::Unoccluded(Integrator *this,Interaction *p0,Interaction *p1)

{
  bool bVar1;
  Ray RStack_38;
  
  Interaction::SpawnRayTo(&RStack_38,p0,p1);
  bVar1 = IntersectP(this,&RStack_38,0.9999);
  return !bVar1;
}

Assistant:

bool Unoccluded(const Interaction &p0, const Interaction &p1) const {
        return !IntersectP(p0.SpawnRayTo(p1), 1 - ShadowEpsilon);
    }